

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

Status adios2sys::SystemTools::Touch(string *filename,bool create)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *__path;
  byte in_SIL;
  FILE *file;
  string *in_stack_ffffffffffffffd8;
  string *in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  bVar1 = FileExists(in_stack_ffffffffffffffd8);
  if (bVar1) {
    __path = (char *)std::__cxx11::string::c_str();
    iVar2 = utimensat(-100,__path,(timespec *)0x0,0);
    if (iVar2 < 0) {
      local_8 = Status::POSIX_errno();
    }
    else {
      local_8 = Status::Success();
    }
  }
  else if ((in_SIL & 1) == 0) {
    local_8 = Status::Success();
  }
  else {
    __stream = (FILE *)Fopen(in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8);
    if (__stream == (FILE *)0x0) {
      local_8 = Status::POSIX_errno();
    }
    else {
      fclose(__stream);
      local_8 = Status::Success();
    }
  }
  return local_8;
}

Assistant:

Status SystemTools::Touch(std::string const& filename, bool create)
{
  if (!SystemTools::FileExists(filename)) {
    if (create) {
      FILE* file = Fopen(filename, "a+b");
      if (file) {
        fclose(file);
        return Status::Success();
      }
      return Status::POSIX_errno();
    } else {
      return Status::Success();
    }
  }
#if defined(_WIN32) && !defined(__CYGWIN__)
  HANDLE h = CreateFileW(Encoding::ToWindowsExtendedPath(filename).c_str(),
                         FILE_WRITE_ATTRIBUTES, FILE_SHARE_WRITE, 0,
                         OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0);
  if (!h) {
    return Status::Windows_GetLastError();
  }
  FILETIME mtime;
  GetSystemTimeAsFileTime(&mtime);
  if (!SetFileTime(h, 0, 0, &mtime)) {
    Status status = Status::Windows_GetLastError();
    CloseHandle(h);
    return status;
  }
  CloseHandle(h);
#elif KWSYS_CXX_HAS_UTIMENSAT
  // utimensat is only available on newer Unixes and macOS 10.13+
  if (utimensat(AT_FDCWD, filename.c_str(), nullptr, 0) < 0) {
    return Status::POSIX_errno();
  }
#else
  // fall back to utimes
  if (utimes(filename.c_str(), nullptr) < 0) {
    return Status::POSIX_errno();
  }
#endif
  return Status::Success();
}